

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonOneofFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  mapped_type *pmVar1;
  key_type *this_00;
  allocator local_119;
  key_type local_118;
  string local_f8;
  key_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  key_type local_98;
  string local_78;
  string local_58;
  string local_38;
  
  oneof_name_abi_cxx11_(&local_f8,this);
  std::__cxx11::string::string((string *)&local_118,"oneof_name",(allocator *)&local_d8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_118);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c) == 2) {
    property_name_abi_cxx11_(&local_118,this);
    std::operator+(&local_f8,"Has",&local_118);
    std::__cxx11::string::string((string *)&local_d8,"has_property_check",(allocator *)&local_b8);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    this_00 = &local_118;
  }
  else {
    oneof_name_abi_cxx11_(&local_38,this);
    std::operator+(&local_b8,&local_38,"Case_ == ");
    oneof_property_name_abi_cxx11_(&local_58,this);
    std::operator+(&local_d8,&local_b8,&local_58);
    std::operator+(&local_118,&local_d8,"OneofCase.");
    property_name_abi_cxx11_(&local_78,this);
    std::operator+(&local_f8,&local_118,&local_78);
    std::__cxx11::string::string((string *)&local_98,"has_property_check",&local_119);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_98);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_b8);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  oneof_property_name_abi_cxx11_(&local_f8,this);
  std::__cxx11::string::string((string *)&local_118,"oneof_property_name",(allocator *)&local_d8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_118);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonOneofFieldVariables(
    std::map<string, string>* variables) {
  (*variables)["oneof_name"] = oneof_name();
  if (IsProto2(descriptor_->file())) {
    (*variables)["has_property_check"] = "Has" + property_name();
  } else {
    (*variables)["has_property_check"] =
      oneof_name() + "Case_ == " + oneof_property_name() +
      "OneofCase." + property_name();
  }
  (*variables)["oneof_property_name"] = oneof_property_name();
}